

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

bool rewriteProgram(AssemblyCommands *commands,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *tempToColorMap,RegisterInfo *registerInfo)

{
  int iVar1;
  int newSpilledCount;
  RegisterInfo *registerInfo_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *tempToColorMap_local;
  AssemblyCommands *commands_local;
  
  iVar1 = countSpilled(tempToColorMap);
  if (iVar1 != 0) {
    processSpilledTemps(commands,tempToColorMap,registerInfo);
  }
  else {
    addFirstLineAllocation(commands,registerInfo);
    colorToRegistersChange(commands,tempToColorMap,registerInfo);
  }
  commands_local._7_1_ = iVar1 == 0;
  return commands_local._7_1_;
}

Assistant:

bool rewriteProgram(AssemblyCommands& commands,
                    std::map<std::string, int>& tempToColorMap,
                    AssemblyCode::RegisterInfo& registerInfo) {

    int newSpilledCount = countSpilled(tempToColorMap);
    if (newSpilledCount == 0) {
        addFirstLineAllocation(commands, registerInfo);
        colorToRegistersChange(commands, tempToColorMap, registerInfo);
        return true;
    } else {
        processSpilledTemps(commands, tempToColorMap, registerInfo);
        return false;
    }
}